

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O3

void Of_ManPrintInit(Of_Man_t *p)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  
  if (p->pPars->fVerbose != 0) {
    printf("LutSize = %d  ",(ulong)(uint)p->pPars->nLutSize);
    printf("CutNum = %d  ",(ulong)(uint)p->pPars->nCutNum);
    printf("Iter = %d  ",(ulong)(uint)(p->pPars->nRoundsEla + p->pPars->nRounds));
    printf("Coarse = %d   ");
    if (p->pPars->fCutMin != 0) {
      printf("Funcs = %d  ");
    }
    piVar1 = p->pGia->pSibls;
    if ((piVar1 != (int *)0x0) && (lVar2 = (long)p->pGia->nObjs, 0 < lVar2)) {
      lVar3 = 0;
      iVar4 = 0;
      do {
        iVar4 = iVar4 + (uint)(0 < piVar1[lVar3]);
        lVar3 = lVar3 + 1;
      } while (lVar2 != lVar3);
      if (iVar4 != 0) {
        printf("Choices = %d  ");
      }
    }
    putchar(10);
    printf("Computing cuts...\r");
    fflush(_stdout);
  }
  return;
}

Assistant:

void Of_ManPrintInit( Of_Man_t * p )
{
    int nChoices;
    if ( !p->pPars->fVerbose )
        return;
    printf( "LutSize = %d  ", p->pPars->nLutSize );
    printf( "CutNum = %d  ",  p->pPars->nCutNum );
    printf( "Iter = %d  ",    p->pPars->nRounds + p->pPars->nRoundsEla );
    printf( "Coarse = %d   ", p->pPars->fCoarsen );
    if ( p->pPars->fCutMin )
    printf( "Funcs = %d  ",   Vec_MemEntryNum(p->vTtMem) );
    nChoices = Gia_ManChoiceNum( p->pGia );
    if ( nChoices )
    printf( "Choices = %d  ", nChoices );
    printf( "\n" );
    printf( "Computing cuts...\r" );
    fflush( stdout );
}